

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_reader.cpp
# Opt level: O3

void __thiscall
duckdb::ParquetColumnSchema::ParquetColumnSchema
          (ParquetColumnSchema *this,idx_t max_define,idx_t max_repeat,idx_t schema_index,
          idx_t column_index,ParquetColumnSchemaType schema_type)

{
  string local_68;
  LogicalType local_48;
  
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  LogicalType::LogicalType(&local_48,INVALID);
  ParquetColumnSchema(this,&local_68,&local_48,max_define,max_repeat,schema_index,column_index,
                      schema_type);
  LogicalType::~LogicalType(&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  return;
}

Assistant:

ParquetColumnSchema::ParquetColumnSchema(idx_t max_define, idx_t max_repeat, idx_t schema_index, idx_t column_index,
                                         ParquetColumnSchemaType schema_type)
    : ParquetColumnSchema(string(), LogicalTypeId::INVALID, max_define, max_repeat, schema_index, column_index,
                          schema_type) {
}